

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavScrollToBringItemIntoView(ImGuiWindow *window,ImRect *item_rect)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiContext *g;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  undefined1 local_28 [8];
  ImRect window_rect;
  ImRect *item_rect_local;
  ImGuiWindow *window_local;
  
  window_rect.Max = (ImVec2)item_rect;
  ImVec2::ImVec2(&local_38,1.0,1.0);
  local_30 = operator-(&(window->InnerMainRect).Min,&local_38);
  ImVec2::ImVec2((ImVec2 *)&g,1.0,1.0);
  local_40 = operator+(&(window->InnerMainRect).Max,(ImVec2 *)&g);
  ImRect::ImRect((ImRect *)local_28,&local_30,&local_40);
  bVar2 = ImRect::Contains((ImRect *)local_28,(ImRect *)window_rect.Max);
  pIVar1 = GImGui;
  if (!bVar2) {
    if (((window->ScrollbarX & 1U) == 0) || ((float)local_28._0_4_ <= *(float *)window_rect.Max)) {
      if (((window->ScrollbarX & 1U) != 0) &&
         (window_rect.Min.x <= *(float *)((long)window_rect.Max + 8))) {
        (window->ScrollTarget).x =
             (*(float *)((long)window_rect.Max + 8) - (window->Pos).x) + (window->Scroll).x +
             (GImGui->Style).ItemSpacing.x;
        (window->ScrollTargetCenterRatio).x = 1.0;
      }
    }
    else {
      (window->ScrollTarget).x =
           ((*(float *)window_rect.Max - (window->Pos).x) + (window->Scroll).x) -
           (GImGui->Style).ItemSpacing.x;
      (window->ScrollTargetCenterRatio).x = 0.0;
    }
    if ((float)local_28._4_4_ <= *(float *)((long)window_rect.Max + 4)) {
      if (window_rect.Min.y <= *(float *)((long)window_rect.Max + 0xc)) {
        (window->ScrollTarget).y =
             (*(float *)((long)window_rect.Max + 0xc) - (window->Pos).y) + (window->Scroll).y +
             (pIVar1->Style).ItemSpacing.y;
        (window->ScrollTargetCenterRatio).y = 1.0;
      }
    }
    else {
      (window->ScrollTarget).y =
           ((*(float *)((long)window_rect.Max + 4) - (window->Pos).y) + (window->Scroll).y) -
           (pIVar1->Style).ItemSpacing.y;
      (window->ScrollTargetCenterRatio).y = 0.0;
    }
  }
  return;
}

Assistant:

static void NavScrollToBringItemIntoView(ImGuiWindow* window, const ImRect& item_rect)
{
    ImRect window_rect(window->InnerMainRect.Min - ImVec2(1, 1), window->InnerMainRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]
    if (window_rect.Contains(item_rect))
        return;

    ImGuiContext& g = *GImGui;
    if (window->ScrollbarX && item_rect.Min.x < window_rect.Min.x)
    {
        window->ScrollTarget.x = item_rect.Min.x - window->Pos.x + window->Scroll.x - g.Style.ItemSpacing.x;
        window->ScrollTargetCenterRatio.x = 0.0f;
    }
    else if (window->ScrollbarX && item_rect.Max.x >= window_rect.Max.x)
    {
        window->ScrollTarget.x = item_rect.Max.x - window->Pos.x + window->Scroll.x + g.Style.ItemSpacing.x;
        window->ScrollTargetCenterRatio.x = 1.0f;
    }
    if (item_rect.Min.y < window_rect.Min.y)
    {
        window->ScrollTarget.y = item_rect.Min.y - window->Pos.y + window->Scroll.y - g.Style.ItemSpacing.y;
        window->ScrollTargetCenterRatio.y = 0.0f;
    }
    else if (item_rect.Max.y >= window_rect.Max.y)
    {
        window->ScrollTarget.y = item_rect.Max.y - window->Pos.y + window->Scroll.y + g.Style.ItemSpacing.y;
        window->ScrollTargetCenterRatio.y = 1.0f;
    }
}